

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NetTypeDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetTypeDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::parsing::Token&,slang::syntax::WithFunctionClauseSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataTypeSyntax *args_2,Token *args_3,WithFunctionClauseSyntax **args_4,
          Token *args_5)

{
  Info *pIVar1;
  WithFunctionClauseSyntax *pWVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  Info *pIVar6;
  SyntaxKind SVar7;
  undefined4 uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  TokenKind TVar17;
  undefined1 uVar18;
  NumericTokenFlags NVar19;
  uint32_t uVar20;
  NetTypeDeclarationSyntax *pNVar21;
  long lVar22;
  
  pNVar21 = (NetTypeDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetTypeDeclarationSyntax *)this->endPtr < pNVar21 + 1) {
    pNVar21 = (NetTypeDeclarationSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pNVar21 + 1);
  }
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar5 = args_3->info;
  pWVar2 = *args_4;
  TVar17 = args_5->kind;
  uVar18 = args_5->field_0x2;
  NVar19.raw = (args_5->numFlags).raw;
  uVar20 = args_5->rawLen;
  pIVar6 = args_5->info;
  (pNVar21->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pNVar21->super_MemberSyntax).super_SyntaxNode.kind = NetTypeDeclaration;
  SVar7 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar8 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar7;
  *(undefined4 *)
   &(pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar8
  ;
  (pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pNVar21->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pNVar21->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (pNVar21->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pNVar21;
  sVar3 = (pNVar21->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pNVar21->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar22 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar22) = pNVar21;
      lVar22 = lVar22 + 8;
    } while (sVar3 << 3 != lVar22);
  }
  (pNVar21->keyword).kind = TVar9;
  (pNVar21->keyword).field_0x2 = uVar10;
  (pNVar21->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pNVar21->keyword).rawLen = uVar12;
  (pNVar21->keyword).info = pIVar1;
  (pNVar21->type).ptr = args_2;
  (pNVar21->name).kind = TVar13;
  (pNVar21->name).field_0x2 = uVar14;
  (pNVar21->name).numFlags = (NumericTokenFlags)NVar15.raw;
  (pNVar21->name).rawLen = uVar16;
  (pNVar21->name).info = pIVar5;
  pNVar21->withFunction = pWVar2;
  (pNVar21->semi).kind = TVar17;
  (pNVar21->semi).field_0x2 = uVar18;
  (pNVar21->semi).numFlags = (NumericTokenFlags)NVar19.raw;
  (pNVar21->semi).rawLen = uVar20;
  (pNVar21->semi).info = pIVar6;
  (args_2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pNVar21;
  if (pWVar2 != (WithFunctionClauseSyntax *)0x0) {
    (pWVar2->super_SyntaxNode).parent = (SyntaxNode *)pNVar21;
  }
  return pNVar21;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }